

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error
PVG_FT_Stroker_CubicTo
          (PVG_FT_Stroker stroker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,PVG_FT_Vector *to)

{
  PVG_FT_Vector *pPVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  PVG_FT_Pos PVar5;
  bool bVar6;
  ulong uVar7;
  PVG_FT_Angle PVar8;
  PVG_FT_Angle angle2;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  PVG_FT_Angle PVar12;
  PVG_FT_Angle PVar13;
  PVG_FT_Angle PVar14;
  PVG_FT_Fixed PVar15;
  PVG_FT_Long length;
  PVG_FT_Long PVar16;
  PVG_FT_Angle PVar17;
  PVG_FT_Fixed PVar18;
  PVG_FT_Long length_00;
  long lVar19;
  long lVar20;
  PVG_FT_StrokeBorder border;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long dy;
  ulong uVar25;
  long dy_00;
  long dx;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  PVG_FT_Angle local_368;
  PVG_FT_Vector end;
  PVG_FT_Vector start;
  PVG_FT_Vector local_2d8;
  PVG_FT_Vector local_2c8;
  PVG_FT_StrokeBorder local_2b0;
  PVG_FT_Vector local_2a8;
  PVG_FT_Vector local_298;
  PVG_FT_Vector bez_stack [37];
  
  pPVar1 = &stroker->center;
  if (((((((stroker->center).x - control1->x) + 1U < 3) &&
        (((stroker->center).y - control1->y) + 1U < 3)) && ((control1->x - control2->x) + 1U < 3))
      && (((control1->y - control2->y) + 1U < 3 && ((control2->x - to->x) + 1U < 3)))) &&
     ((control2->y - to->y) + 1U < 3)) {
    PVar5 = to->y;
    pPVar1->x = to->x;
    (stroker->center).y = PVar5;
    return 0;
  }
  bez_stack[0].x = to->x;
  bez_stack[0].y = to->y;
  bez_stack[1].x = control2->x;
  bez_stack[1].y = control2->y;
  bez_stack[2].x = control1->x;
  bez_stack[2].y = control1->y;
  bez_stack[3].x = pPVar1->x;
  bez_stack[3].y = (stroker->center).y;
  local_2b0 = stroker->borders;
  bVar6 = false;
  uVar25 = 0;
  do {
    uVar25 = uVar25 - 0x30;
    while( true ) {
      uVar7 = uVar25 + 0x30;
      if ((long)uVar7 < 0) {
        PVar5 = to->y;
        pPVar1->x = to->x;
        (stroker->center).y = PVar5;
        stroker->line_length = 0;
        return 0;
      }
      PVar8 = stroker->angle_in;
      PVar14 = PVar8;
      angle2 = PVar8;
      if (0x1ff < uVar7) break;
      lVar20 = *(long *)((long)&bez_stack[5].x + uVar25);
      lVar21 = *(long *)((long)&bez_stack[6].x + uVar25);
      lVar19 = *(long *)((long)&bez_stack[5].y + uVar25);
      lVar2 = *(long *)((long)&bez_stack[6].y + uVar25);
      lVar3 = *(long *)((long)&bez_stack[4].x + uVar25);
      dx = lVar3 - lVar20;
      lVar4 = *(long *)((long)&bez_stack[4].y + uVar25);
      dy_00 = lVar4 - lVar19;
      lVar22 = *(long *)((long)&bez_stack[3].x + uVar25);
      lVar23 = *(long *)((long)&bez_stack[3].y + uVar25);
      lVar24 = lVar22 - lVar3;
      dy = lVar23 - lVar4;
      bVar26 = 2 < dx + 1U;
      bVar27 = 2 < dy_00 + 1U;
      bVar28 = 2 < lVar24 + 1U;
      bVar29 = 2 < dy + 1U;
      if (((lVar20 - lVar21) + 1U < 3) && ((lVar19 - lVar2) + 1U < 3)) {
        if (bVar27 || bVar26) {
          PVar8 = PVG_FT_Atan2(dx,dy_00);
          PVar14 = PVar8;
          angle2 = PVar8;
          if (bVar29 || bVar28) {
            angle2 = PVG_FT_Atan2(lVar24,dy);
          }
        }
        else if (bVar29 || bVar28) {
          PVar8 = PVG_FT_Atan2(lVar24,dy);
          PVar14 = PVar8;
          angle2 = PVar8;
        }
      }
      else {
        PVar8 = PVG_FT_Atan2(lVar20 - lVar21,lVar19 - lVar2);
        if (bVar27 || bVar26) {
          PVar14 = PVG_FT_Atan2(dx,dy_00);
          angle2 = PVar14;
          if (bVar29 || bVar28) {
            angle2 = PVG_FT_Atan2(lVar24,dy);
          }
        }
        else {
          PVar14 = PVar8;
          angle2 = PVar8;
          if (bVar29 || bVar28) {
            angle2 = PVG_FT_Atan2(lVar24,dy);
            PVar14 = ft_angle_mean(PVar8,angle2);
          }
        }
      }
      uVar9 = PVG_FT_Angle_Diff(PVar8,PVar14);
      uVar11 = -uVar9;
      if (0 < (long)uVar9) {
        uVar11 = uVar9;
      }
      uVar10 = PVG_FT_Angle_Diff(PVar14,angle2);
      uVar9 = -uVar10;
      if (0 < (long)uVar10) {
        uVar9 = uVar10;
      }
      if ((uVar11 < 0x168000) && (uVar9 < 0x168000)) break;
      if (stroker->first_point != '\0') {
        stroker->angle_in = PVar8;
      }
      *(long *)((long)&bez_stack[9].x + uVar25) = lVar21;
      lVar22 = lVar22 + lVar3;
      lVar24 = lVar3 + lVar20 + lVar21 + lVar20;
      *(long *)((long)&bez_stack[8].x + uVar25) = lVar21 + lVar20 >> 1;
      lVar20 = lVar3 + lVar20 + lVar22;
      *(long *)((long)&bez_stack[7].x + uVar25) = lVar24 >> 2;
      *(long *)((long)&bez_stack[4].x + uVar25) = lVar22 >> 1;
      *(long *)((long)&bez_stack[5].x + uVar25) = lVar20 >> 2;
      *(long *)((long)&bez_stack[6].x + uVar25) = lVar20 + lVar24 >> 3;
      *(long *)((long)&bez_stack[9].y + uVar25) = lVar2;
      lVar23 = lVar23 + lVar4;
      lVar20 = lVar2 + lVar19 + lVar4 + lVar19;
      *(long *)((long)&bez_stack[8].y + uVar25) = lVar2 + lVar19 >> 1;
      lVar21 = lVar4 + lVar19 + lVar23;
      *(long *)((long)&bez_stack[7].y + uVar25) = lVar20 >> 2;
      *(long *)((long)&bez_stack[4].y + uVar25) = lVar23 >> 1;
      *(long *)((long)&bez_stack[5].y + uVar25) = lVar21 >> 2;
      *(long *)((long)&bez_stack[6].y + uVar25) = lVar21 + lVar20 >> 3;
      uVar25 = uVar7;
    }
    if (bVar6) {
      uVar11 = PVG_FT_Angle_Diff(stroker->angle_in,PVar8);
      uVar7 = -uVar11;
      if (0 < (long)uVar11) {
        uVar7 = uVar11;
      }
      if (0x5a000 < uVar7) {
        PVar5 = *(PVG_FT_Pos *)((long)&bez_stack[6].y + uVar25);
        pPVar1->x = *(PVG_FT_Pos *)((long)&bez_stack[6].x + uVar25);
        (stroker->center).y = PVar5;
        stroker->angle_out = PVar8;
        stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
        ft_stroker_process_corner(stroker,0);
        stroker->line_join = stroker->line_join_saved;
      }
    }
    else if (stroker->first_point == '\0') {
      stroker->angle_out = PVar8;
      ft_stroker_process_corner(stroker,0);
    }
    else {
      ft_stroker_subpath_start(stroker,PVar8,0);
    }
    PVar12 = PVG_FT_Angle_Diff(PVar8,PVar14);
    PVar13 = PVG_FT_Angle_Diff(PVar14,angle2);
    PVar8 = ft_angle_mean(PVar8,PVar14);
    PVar14 = ft_angle_mean(PVar14,angle2);
    PVar16 = stroker->radius;
    PVar15 = PVG_FT_Cos(PVar12 / 2);
    length = PVG_FT_DivFix(PVar16,PVar15);
    PVar16 = stroker->radius;
    PVar15 = PVG_FT_Cos(PVar13 / 2);
    PVar16 = PVG_FT_DivFix(PVar16,PVar15);
    if (stroker->handle_wide_strokes == '\0') {
      local_368 = 0;
    }
    else {
      local_368 = PVG_FT_Atan2(*(long *)((long)&bez_stack[3].x + uVar25) -
                               *(long *)((long)&bez_stack[6].x + uVar25),
                               *(long *)((long)&bez_stack[3].y + uVar25) -
                               *(long *)((long)&bez_stack[6].y + uVar25));
    }
    border = local_2b0;
    for (lVar20 = 0; lVar20 != -0x1680000; lVar20 = lVar20 + -0xb40000) {
      PVG_FT_Vector_From_Polar(&local_2c8,length,PVar8 + 0x5a0000 + lVar20);
      local_2c8.x = *(long *)((long)&bez_stack[5].x + uVar25) + local_2c8.x;
      local_2c8.y = *(long *)((long)&bez_stack[5].y + uVar25) + local_2c8.y;
      PVG_FT_Vector_From_Polar(&local_2d8,PVar16,PVar14 + 0x5a0000 + lVar20);
      local_2d8.x = *(long *)((long)&bez_stack[4].x + uVar25) + local_2d8.x;
      local_2d8.y = *(long *)((long)&bez_stack[4].y + uVar25) + local_2d8.y;
      PVG_FT_Vector_From_Polar(&end,stroker->radius,angle2 + 0x5a0000 + lVar20);
      lVar21 = *(long *)((long)&bez_stack[3].x + uVar25);
      lVar19 = *(long *)((long)&bez_stack[3].y + uVar25);
      end.x = end.x + lVar21;
      end.y = end.y + lVar19;
      if (stroker->handle_wide_strokes == '\0') {
LAB_00135f62:
        ft_stroke_border_cubicto(border,&local_2c8,&local_2d8,&end);
      }
      else {
        lVar2 = border->points[border->num_points - 1].x;
        lVar3 = border->points[border->num_points - 1].y;
        start.x = lVar2;
        start.y = lVar3;
        PVar12 = PVG_FT_Atan2(end.x - lVar2,end.y - lVar3);
        uVar11 = PVG_FT_Angle_Diff(local_368,PVar12);
        uVar7 = -uVar11;
        if (0 < (long)uVar11) {
          uVar7 = uVar11;
        }
        if (uVar7 < 0x5a0001) goto LAB_00135f62;
        PVar13 = PVG_FT_Atan2(*(long *)((long)&bez_stack[6].x + uVar25) - lVar2,
                              *(long *)((long)&bez_stack[6].y + uVar25) - lVar3);
        PVar17 = PVG_FT_Atan2(lVar21 - end.x,lVar19 - end.y);
        local_298.x = end.x - lVar2;
        local_298.y = end.y - lVar3;
        PVar15 = PVG_FT_Vector_Length(&local_298);
        PVar18 = PVG_FT_Sin(PVar12 - PVar17);
        lVar21 = -PVar18;
        if (0 < PVar18) {
          lVar21 = PVar18;
        }
        PVar18 = PVG_FT_Sin(PVar13 - PVar17);
        lVar19 = -PVar18;
        if (0 < PVar18) {
          lVar19 = PVar18;
        }
        length_00 = PVG_FT_MulDiv(PVar15,lVar21,lVar19);
        PVG_FT_Vector_From_Polar(&local_2a8,length_00,PVar13);
        local_2a8.x = lVar2 + local_2a8.x;
        local_2a8.y = lVar3 + local_2a8.y;
        border->movable = '\0';
        ft_stroke_border_lineto(border,&local_2a8,'\0');
        ft_stroke_border_lineto(border,&end,'\0');
        ft_stroke_border_cubicto(border,&local_2d8,&local_2c8,&start);
        ft_stroke_border_lineto(border,&end,'\0');
      }
      border = border + 1;
    }
    stroker->angle_in = angle2;
    bVar6 = true;
  } while( true );
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_CubicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control1,
                                  PVG_FT_Vector* control2, PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[37];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 32;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if (PVG_FT_IS_SMALL(stroker->center.x - control1->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control1->y) &&
        PVG_FT_IS_SMALL(control1->x - control2->x) &&
        PVG_FT_IS_SMALL(control1->y - control2->y) &&
        PVG_FT_IS_SMALL(control2->x - to->x) &&
        PVG_FT_IS_SMALL(control2->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_mid, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = angle_mid = stroker->angle_in;

        if (arc < limit &&
            !ft_cubic_is_small_enough(arc, &angle_in, &angle_mid, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_cubic_split(arc);
            arc += 3;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CUBIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[3];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl1, ctrl2, end;
            PVG_FT_Angle        theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
            PVG_FT_Fixed        length1, length2;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta1 = PVG_FT_Angle_Diff(angle_in, angle_mid) / 2;
            theta2 = PVG_FT_Angle_Diff(angle_mid, angle_out) / 2;
            phi1 = ft_angle_mean(angle_in, angle_mid);
            phi2 = ft_angle_mean(angle_mid, angle_out);
            length1 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta1));
            length2 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta2));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[3].x, arc[0].y - arc[3].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control points */
                PVG_FT_Vector_From_Polar(&ctrl1, length1, phi1 + rotate);
                ctrl1.x += arc[2].x;
                ctrl1.y += arc[2].y;

                PVG_FT_Vector_From_Polar(&ctrl2, length2, phi2 + rotate);
                ctrl2.x += arc[1].x;
                ctrl2.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[3].x - start.x, arc[3].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_cubicto(border, &ctrl2, &ctrl1,
                                                         &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_cubicto(border, &ctrl1, &ctrl2, &end);
                if (error) goto Exit;
            }
        }

        arc -= 3;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}